

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BDVFile.cpp
# Opt level: O2

void decode_bdv(char *buf,size_t buffer_size)

{
  int iVar1;
  size_t i;
  size_t sVar2;
  int iVar3;
  char cVar4;
  
  iVar3 = 0xa0;
  for (sVar2 = 0; buffer_size != sVar2; sVar2 = sVar2 + 1) {
    cVar4 = buf[sVar2];
    if ((cVar4 != '\0') && (cVar4 != '\n')) {
      if (cVar4 == '\r') {
        iVar3 = iVar3 + (uint)(buf[sVar2 + 1] == '\n');
        cVar4 = '\r';
      }
      else {
        cVar4 = (char)iVar3 - cVar4;
      }
    }
    iVar1 = 0x9f;
    if (iVar3 < 0x11e) {
      iVar1 = iVar3;
    }
    iVar3 = iVar1;
    buf[sVar2] = cVar4;
  }
  return;
}

Assistant:

void decode_bdv(char *buf, size_t buffer_size) {
	int count = 0xa0; // First key
	for (size_t i = 0; i < buffer_size; i++) {
		if (buf[i] == '\r' && buf[i + 1] == '\n') count++; // Increment key on each new line
		char x                                 = buf[i];
		if (!(x == '\r' || x == '\n' || !x)) x = count - x;
		if (count > 285) count                 = 159;
		buf[i]                                 = x;
	}
}